

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

void emit_varname(Function *fn,Pseudo *pseudo)

{
  TextBuffer *mb;
  Pseudo *pseudo_local;
  Function *fn_local;
  
  if ((((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0x2) ||
     (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0x3)) {
    raviX_buffer_add_fstring(&fn->body,"%s%d",int_var_prefix,(ulong)(*(uint *)pseudo >> 4 & 0xffff))
    ;
  }
  else if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0x1) {
    raviX_buffer_add_fstring(&fn->body,"%s%d",flt_var_prefix,(ulong)(*(uint *)pseudo >> 4 & 0xffff))
    ;
  }
  else {
    handle_error_bad_pseudo(fn,pseudo,"Unexpected pseudo type");
  }
  return;
}

Assistant:

static void emit_varname(Function *fn, const Pseudo *pseudo)
{
	TextBuffer *mb = &fn->body;
	if (pseudo->type == PSEUDO_TEMP_INT || pseudo->type == PSEUDO_TEMP_BOOL) {
		raviX_buffer_add_fstring(mb, "%s%d", int_var_prefix, pseudo->regnum);
	} else if (pseudo->type == PSEUDO_TEMP_FLT) {
		raviX_buffer_add_fstring(mb, "%s%d", flt_var_prefix, pseudo->regnum);
	} else {
		handle_error_bad_pseudo(fn, pseudo, "Unexpected pseudo type");
	}
}